

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void absl::lts_20240722::container_internal::DoSanitizeOnSetCtrl
               (CommonFields *c,size_t i,ctrl_t h,size_t slot_size)

{
  bool bVar1;
  size_t sVar2;
  void *pvVar3;
  char *slot_i;
  size_t slot_size_local;
  ctrl_t h_local;
  size_t i_local;
  CommonFields *c_local;
  
  sVar2 = CommonFields::capacity(c);
  if (i < sVar2) {
    pvVar3 = CommonFields::slot_array(c);
    pvVar3 = (void *)((long)pvVar3 + i * slot_size);
    bVar1 = IsFull(h);
    if (bVar1) {
      SanitizerUnpoisonMemoryRegion(pvVar3,slot_size);
    }
    else {
      SanitizerPoisonMemoryRegion(pvVar3,slot_size);
    }
    return;
  }
  __assert_fail("i < c.capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x70c,
                "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
               );
}

Assistant:

inline void DoSanitizeOnSetCtrl(const CommonFields& c, size_t i, ctrl_t h,
                                size_t slot_size) {
  assert(i < c.capacity());
  auto* slot_i = static_cast<const char*>(c.slot_array()) + i * slot_size;
  if (IsFull(h)) {
    SanitizerUnpoisonMemoryRegion(slot_i, slot_size);
  } else {
    SanitizerPoisonMemoryRegion(slot_i, slot_size);
  }
}